

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_impl.h
# Opt level: O3

int secp256k1_fe_equal(secp256k1_fe *a,secp256k1_fe *b)

{
  uint *puVar1;
  uint *puVar2;
  byte bVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  char cVar7;
  int iVar8;
  int extraout_EAX;
  int extraout_EAX_00;
  long lVar9;
  uchar *in_RCX;
  secp256k1_sha256 *psVar10;
  ulong uVar11;
  secp256k1_pubkey *pubkey;
  secp256k1_ecmult_gen_context *extraout_RDX;
  secp256k1_fe *b_00;
  uchar *seckey;
  secp256k1_ecmult_gen_context *a_00;
  secp256k1_ecmult_gen_context *psVar12;
  uint uVar13;
  uint64_t uVar14;
  undefined1 *puVar16;
  undefined1 *puVar17;
  undefined1 *puVar18;
  undefined1 *puVar19;
  undefined1 *puVar20;
  undefined1 *puVar21;
  uchar *puVar22;
  ulong uVar23;
  secp256k1_ecmult_gen_context *a_01;
  secp256k1_ecmult_gen_context *psVar24;
  secp256k1_context *ctx;
  ulong uVar25;
  ulong uVar26;
  secp256k1_ecmult_gen_context *psVar27;
  secp256k1_ecmult_gen_context *ecmult_gen_ctx;
  uint64_t uVar28;
  secp256k1_ecmult_gen_context *r;
  uint64_t uVar29;
  ulong uVar30;
  secp256k1_ecmult_gen_context *psVar31;
  secp256k1_ecmult_gen_context *r_00;
  uint64_t uVar32;
  undefined1 auVar33 [16];
  secp256k1_fe na;
  secp256k1_scalar sStack_56c;
  secp256k1_ge sStack_568;
  secp256k1_sha256 sStack_500;
  secp256k1_fe sStack_498;
  secp256k1_ecmult_gen_context *psStack_468;
  secp256k1_ecmult_gen_context *psStack_460;
  undefined8 uStack_458;
  secp256k1_ecmult_gen_context *psStack_450;
  secp256k1_ecmult_gen_context *psStack_448;
  code *pcStack_440;
  undefined1 auStack_438 [56];
  ulong uStack_400;
  undefined1 *puStack_3f8;
  ulong uStack_3f0;
  uchar *puStack_3e8;
  ulong uStack_3e0;
  uint uStack_3cc;
  undefined1 auStack_3c8 [56];
  uint64_t uStack_390;
  uint64_t uStack_388;
  uint64_t uStack_380;
  uchar *puStack_378;
  uint64_t uStack_370;
  undefined1 auStack_368 [56];
  uint64_t uStack_330;
  uint64_t uStack_328;
  uint64_t uStack_320;
  uchar *puStack_318;
  int iStack_310;
  undefined4 uStack_30c;
  secp256k1_sha256 *psStack_308;
  secp256k1_ecmult_gen_context *psStack_300;
  ulong uStack_2f8;
  secp256k1_ecmult_gen_context *psStack_2f0;
  secp256k1_ecmult_gen_context *psStack_2e8;
  ulong uStack_2e0;
  undefined1 auStack_2d8 [56];
  ulong uStack_2a0;
  ulong uStack_298;
  ulong uStack_290;
  uchar *puStack_288;
  ulong uStack_280;
  undefined1 auStack_278 [160];
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined8 uStack_180;
  undefined1 auStack_170 [72];
  undefined1 auStack_128 [152];
  secp256k1_fe *psStack_90;
  secp256k1_fe *psStack_88;
  secp256k1_fe *psStack_80;
  uint64_t local_70;
  uint64_t local_68;
  secp256k1_fe local_60;
  undefined1 *puVar15;
  
  psStack_80 = (secp256k1_fe *)0x10ebbe;
  secp256k1_fe_verify(a);
  psStack_80 = (secp256k1_fe *)0x10ebc6;
  secp256k1_fe_verify(b);
  psStack_80 = (secp256k1_fe *)0x10ebd4;
  secp256k1_fe_verify_magnitude((secp256k1_fe *)(ulong)(uint)a->magnitude,1);
  psStack_80 = (secp256k1_fe *)0x10ebe1;
  secp256k1_fe_verify_magnitude((secp256k1_fe *)(ulong)(uint)b->magnitude,0x1f);
  psStack_80 = (secp256k1_fe *)0x10ebe9;
  secp256k1_fe_verify(a);
  puVar22 = (uchar *)0x1;
  psStack_80 = (secp256k1_fe *)0x10ebf7;
  secp256k1_fe_verify_magnitude((secp256k1_fe *)(ulong)(uint)a->magnitude,1);
  local_68 = 0x3ffffbfffff0bc - a->n[0];
  uVar28 = 0x3ffffffffffffc - a->n[1];
  uVar14 = 0x3ffffffffffffc - a->n[2];
  local_70 = 0x3ffffffffffffc - a->n[3];
  uVar29 = 0x3fffffffffffc - a->n[4];
  local_60.magnitude = 2;
  local_60.normalized = 0;
  psStack_80 = (secp256k1_fe *)0x10ec60;
  local_60.n[0] = local_68;
  local_60.n[1] = uVar28;
  local_60.n[2] = uVar14;
  local_60.n[3] = local_70;
  local_60.n[4] = uVar29;
  secp256k1_fe_verify(&local_60);
  psStack_80 = (secp256k1_fe *)0x10ec68;
  secp256k1_fe_verify(&local_60);
  psStack_80 = (secp256k1_fe *)0x10ec70;
  ctx = (secp256k1_context *)b;
  secp256k1_fe_verify(b);
  if (b->magnitude < 0x1f) {
    uVar32 = local_68 + b->n[0];
    uVar28 = uVar28 + b->n[1];
    uVar14 = uVar14 + b->n[2];
    local_70 = local_70 + b->n[3];
    uVar30 = uVar29 + b->n[4];
    local_60.normalized = 0;
    local_60.magnitude = b->magnitude + 2;
    psStack_80 = (secp256k1_fe *)0x10eccd;
    local_60.n[0] = uVar32;
    local_60.n[1] = uVar28;
    local_60.n[2] = uVar14;
    local_60.n[3] = local_70;
    local_60.n[4] = uVar30;
    secp256k1_fe_verify(&local_60);
    psStack_80 = (secp256k1_fe *)0x10ecd5;
    secp256k1_fe_verify(&local_60);
    uVar23 = (uVar30 >> 0x30) * 0x1000003d1 + uVar32;
    uVar11 = (uVar23 >> 0x34) + uVar28;
    uVar25 = (uVar11 >> 0x34) + uVar14;
    uVar26 = (uVar25 >> 0x34) + local_70;
    uVar30 = (uVar26 >> 0x34) + (uVar30 & 0xffffffffffff);
    return (int)(((uVar23 ^ 0x1000003d0) & uVar11 & uVar25 & uVar26 & (uVar30 ^ 0xf000000000000)) ==
                 0xfffffffffffff ||
                ((uVar11 | uVar23 | uVar25 | uVar26) & 0xfffffffffffff) == 0 && uVar30 == 0);
  }
  psStack_80 = (secp256k1_fe *)secp256k1_ellswift_encode;
  secp256k1_fe_equal_cold_1();
  psStack_90 = b;
  psStack_88 = a;
  psStack_80 = &local_60;
  if (ctx == (secp256k1_context *)0x0) {
    auStack_278._128_8_ = 0x10eea8;
    secp256k1_ellswift_encode_cold_5();
LAB_0010eea8:
    auStack_278._128_8_ = 0x10eead;
    secp256k1_ellswift_encode_cold_4();
    return 0;
  }
  if (puVar22 == (uchar *)0x0) goto LAB_0010eea8;
  if (pubkey == (secp256k1_pubkey *)0x0) {
    auStack_278._128_8_ = 0x10eeb4;
    secp256k1_ellswift_encode_cold_3();
    return 0;
  }
  if (in_RCX == (uchar *)0x0) {
    auStack_278._128_8_ = 0x10eebb;
    secp256k1_ellswift_encode_cold_2();
    return 0;
  }
  auStack_278._128_8_ = 0x10edb9;
  iVar8 = secp256k1_pubkey_load(ctx,(secp256k1_ge *)auStack_128,pubkey);
  if (iVar8 == 0) {
    puVar22[0x30] = '\0';
    puVar22[0x31] = '\0';
    puVar22[0x32] = '\0';
    puVar22[0x33] = '\0';
    puVar22[0x34] = '\0';
    puVar22[0x35] = '\0';
    puVar22[0x36] = '\0';
    puVar22[0x37] = '\0';
    puVar22[0x38] = '\0';
    puVar22[0x39] = '\0';
    puVar22[0x3a] = '\0';
    puVar22[0x3b] = '\0';
    puVar22[0x3c] = '\0';
    puVar22[0x3d] = '\0';
    puVar22[0x3e] = '\0';
    puVar22[0x3f] = '\0';
    puVar22[0x20] = '\0';
    puVar22[0x21] = '\0';
    puVar22[0x22] = '\0';
    puVar22[0x23] = '\0';
    puVar22[0x24] = '\0';
    puVar22[0x25] = '\0';
    puVar22[0x26] = '\0';
    puVar22[0x27] = '\0';
    puVar22[0x28] = '\0';
    puVar22[0x29] = '\0';
    puVar22[0x2a] = '\0';
    puVar22[0x2b] = '\0';
    puVar22[0x2c] = '\0';
    puVar22[0x2d] = '\0';
    puVar22[0x2e] = '\0';
    puVar22[0x2f] = '\0';
    puVar22[0x10] = '\0';
    puVar22[0x11] = '\0';
    puVar22[0x12] = '\0';
    puVar22[0x13] = '\0';
    puVar22[0x14] = '\0';
    puVar22[0x15] = '\0';
    puVar22[0x16] = '\0';
    puVar22[0x17] = '\0';
    puVar22[0x18] = '\0';
    puVar22[0x19] = '\0';
    puVar22[0x1a] = '\0';
    puVar22[0x1b] = '\0';
    puVar22[0x1c] = '\0';
    puVar22[0x1d] = '\0';
    puVar22[0x1e] = '\0';
    puVar22[0x1f] = '\0';
    puVar22[0] = '\0';
    puVar22[1] = '\0';
    puVar22[2] = '\0';
    puVar22[3] = '\0';
    puVar22[4] = '\0';
    puVar22[5] = '\0';
    puVar22[6] = '\0';
    puVar22[7] = '\0';
    puVar22[8] = '\0';
    puVar22[9] = '\0';
    puVar22[10] = '\0';
    puVar22[0xb] = '\0';
    puVar22[0xc] = '\0';
    puVar22[0xd] = '\0';
    puVar22[0xe] = '\0';
    puVar22[0xf] = '\0';
    return 0;
  }
  psVar12 = (secp256k1_ecmult_gen_context *)auStack_170;
  auStack_170._48_4_ = 0;
  auStack_170._52_4_ = 0;
  auStack_170._56_8_ = 0;
  auStack_170._32_8_ = 0;
  auStack_170._40_8_ = 0;
  auStack_170._16_8_ = 0;
  auStack_170._24_8_ = 0;
  auStack_170._0_4_ = 0;
  auStack_170._4_4_ = 0;
  auStack_170._8_8_ = 0;
  auStack_278._152_4_ = -0x2e59adb5;
  auStack_278._156_4_ = 0x28594b3;
  uStack_1d8 = 0x1037a17796e42f4e;
  uStack_1d0 = 0x560238851b8fcb8b;
  uStack_1c8 = 0xd626b7152560ede1;
  uStack_180 = 0x40;
  psVar27 = (secp256k1_ecmult_gen_context *)auStack_128;
  psVar10 = (secp256k1_sha256 *)0x1;
  auStack_278._128_8_ = 0x10ee13;
  iVar8 = secp256k1_eckey_pubkey_serialize
                    ((secp256k1_ge *)psVar27,(uchar *)psVar12,(size_t *)(auStack_278 + 0x90),1);
  if ((iVar8 != 0) && (auStack_278._144_8_ == 0x21)) {
    psVar10 = (secp256k1_sha256 *)(auStack_278 + 0x98);
    auStack_278._128_8_ = 0x10ee41;
    secp256k1_sha256_write(psVar10,auStack_170,0x40);
    auStack_278._128_8_ = 0x10ee51;
    secp256k1_sha256_write(psVar10,in_RCX,0x20);
    auStack_278._128_8_ = 0x10ee6f;
    secp256k1_ellswift_elligatorswift_var
              (puVar22,(secp256k1_fe *)(auStack_128 + 0x68),(secp256k1_ge *)auStack_128,psVar10);
    auStack_278._128_8_ = 0x10ee7e;
    secp256k1_fe_get_b32(puVar22 + 0x20,(secp256k1_fe *)(auStack_128 + 0x68));
    return 1;
  }
  auStack_278._128_8_ = secp256k1_ellswift_elligatorswift_var;
  secp256k1_ellswift_encode_cold_1();
  auStack_278._128_8_ = uVar14;
  auStack_278._120_8_ = &local_60;
  auStack_278._112_8_ = in_RCX;
  auStack_278._104_8_ = uVar29;
  auStack_278._96_8_ = uVar28;
  auStack_278._88_8_ = puVar22;
  a_00 = (secp256k1_ecmult_gen_context *)auStack_438;
  puVar17 = auStack_438;
  puVar18 = auStack_438;
  puVar19 = auStack_438;
  puVar16 = auStack_438;
  puVar20 = auStack_438;
  puVar21 = auStack_438;
  psVar24 = (secp256k1_ecmult_gen_context *)auStack_438;
  psStack_300 = extraout_RDX;
  psStack_2f0 = psVar12;
  psStack_2e8 = psVar27;
  psVar12 = (secp256k1_ecmult_gen_context *)auStack_368;
  psVar27 = (secp256k1_ecmult_gen_context *)(auStack_438 + 0x30);
  uVar23 = 0;
  psStack_308 = psVar10;
  uVar11 = 0;
LAB_0010ef0e:
  iVar8 = (int)uVar11;
  if (iVar8 == 0) {
    pcStack_440 = (code *)0x10ef25;
    secp256k1_ellswift_prng(auStack_278 + 0x30,psStack_308,(uint32_t)uVar23);
    iVar8 = 0x40;
    uVar23 = (ulong)((uint32_t)uVar23 + 1);
  }
  r = psStack_2e8;
  uStack_2f8 = (ulong)(iVar8 - 1U);
  bVar3 = auStack_278[(ulong)(iVar8 - 1U >> 1) + 0x30];
  pcStack_440 = (code *)0x10ef63;
  uStack_2e0 = uVar23;
  secp256k1_ellswift_prng((uchar *)psStack_2e8,psStack_308,(uint32_t)uVar23);
  r_00 = (secp256k1_ecmult_gen_context *)auStack_2d8;
  pcStack_440 = (code *)0x10ef76;
  secp256k1_fe_impl_set_b32_mod((secp256k1_fe *)r_00,(uchar *)r);
  auStack_2d8._40_8_ = 1;
  pcStack_440 = (code *)0x10ef8a;
  secp256k1_fe_verify((secp256k1_fe *)r_00);
  pcStack_440 = (code *)0x10ef92;
  secp256k1_fe_verify((secp256k1_fe *)r_00);
  uVar11 = ((ulong)auStack_2d8._32_8_ >> 0x30) * 0x1000003d1 + auStack_2d8._0_8_;
  if (((uVar11 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar11 & 0xfffffffffffff) == 0)) {
    uVar23 = (uVar11 >> 0x34) + auStack_2d8._8_8_;
    a_01 = (secp256k1_ecmult_gen_context *)((uVar23 >> 0x34) + auStack_2d8._16_8_);
    ecmult_gen_ctx = (secp256k1_ecmult_gen_context *)(((ulong)a_01 >> 0x34) + auStack_2d8._24_8_);
    uVar25 = ((ulong)ecmult_gen_ctx >> 0x34) + (auStack_2d8._32_8_ & 0xffffffffffff);
    puVar22 = (uchar *)((uVar23 | uVar11 | (ulong)a_01 | (ulong)ecmult_gen_ctx) & 0xfffffffffffff |
                       uVar25);
    if ((puVar22 != (uchar *)0x0) &&
       (puVar22 = (uchar *)0x1000003d1,
       (uVar11 + 0x1000003d0 & uVar23 & (ulong)a_01 & (ulong)ecmult_gen_ctx &
       (uVar25 ^ 0xf000000000000)) != 0xfffffffffffff)) goto LAB_0010f063;
    pcStack_440 = (code *)0x10fdfa;
    secp256k1_ellswift_elligatorswift_var_cold_1();
    puVar15 = (undefined1 *)(ulong)bVar3;
LAB_0010fdfa:
    puVar17 = puVar15;
    pcStack_440 = (code *)0x10fdff;
    secp256k1_ellswift_elligatorswift_var_cold_15();
LAB_0010fdff:
    pcStack_440 = (code *)0x10fe04;
    secp256k1_ellswift_elligatorswift_var_cold_7();
    puVar15 = puVar17;
LAB_0010fe04:
    puVar18 = puVar15;
    pcStack_440 = (code *)0x10fe09;
    secp256k1_ellswift_elligatorswift_var_cold_14();
LAB_0010fe09:
    pcStack_440 = (code *)0x10fe0e;
    secp256k1_ellswift_elligatorswift_var_cold_6();
    puVar19 = puVar18;
LAB_0010fe0e:
    pcStack_440 = (code *)0x10fe13;
    secp256k1_ellswift_elligatorswift_var_cold_5();
    puVar16 = puVar19;
LAB_0010fe13:
    pcStack_440 = (code *)0x10fe18;
    secp256k1_ellswift_elligatorswift_var_cold_4();
    goto LAB_0010fe18;
  }
LAB_0010f063:
  bVar3 = bVar3 >> ((char)uStack_2f8 * '\x04' & 4U);
  uVar13 = (uint)bVar3;
  puVar15 = (undefined1 *)(ulong)uVar13;
  auStack_3c8._48_4_ = psStack_300->built;
  auStack_3c8._52_4_ = psStack_300->scalar_offset;
  uStack_390 = (psStack_300->ge_offset).x.n[0];
  uStack_388 = (psStack_300->ge_offset).x.n[1];
  uStack_380 = (psStack_300->ge_offset).x.n[2];
  puStack_378 = (uchar *)(psStack_300->ge_offset).x.n[3];
  uStack_370 = (psStack_300->ge_offset).x.n[4];
  auStack_368._32_8_ = auStack_2d8._32_8_;
  auStack_368._40_8_ = auStack_2d8._40_8_;
  auStack_368._16_8_ = auStack_2d8._16_8_;
  auStack_368._24_8_ = auStack_2d8._24_8_;
  auStack_368._0_8_ = auStack_2d8._0_8_;
  auStack_368._8_8_ = auStack_2d8._8_8_;
  r_00 = (secp256k1_ecmult_gen_context *)(auStack_3c8 + 0x30);
  pcStack_440 = (code *)0x10f0e2;
  secp256k1_fe_verify((secp256k1_fe *)r_00);
  auStack_3c8._48_8_ = ((ulong)puStack_378 >> 0x30) * 0x1000003d1 + auStack_3c8._48_8_;
  uVar11 = ((ulong)auStack_3c8._48_8_ >> 0x34) + uStack_390;
  uVar23 = (uVar11 >> 0x34) + uStack_388;
  uVar25 = (uVar23 >> 0x34) + uStack_380;
  uStack_380 = uVar25 & 0xfffffffffffff;
  puStack_378 = (uchar *)((uVar25 >> 0x34) + ((ulong)puStack_378 & 0xffffffffffff));
  uStack_388 = uVar23 & 0xfffffffffffff;
  uStack_390 = uVar11 & 0xfffffffffffff;
  auStack_3c8._48_8_ = auStack_3c8._48_8_ & 0xfffffffffffff;
  uStack_370 = CONCAT44(uStack_370._4_4_,1);
  pcStack_440 = (code *)0x10f196;
  secp256k1_fe_verify((secp256k1_fe *)r_00);
  pcStack_440 = (code *)0x10f19e;
  secp256k1_fe_verify((secp256k1_fe *)psVar12);
  auStack_368._0_8_ = ((ulong)auStack_368._32_8_ >> 0x30) * 0x1000003d1 + auStack_368._0_8_;
  auStack_368._8_8_ = ((ulong)auStack_368._0_8_ >> 0x34) + auStack_368._8_8_;
  uVar11 = ((ulong)auStack_368._8_8_ >> 0x34) + auStack_368._16_8_;
  uVar23 = (uVar11 >> 0x34) + auStack_368._24_8_;
  auStack_368._24_8_ = uVar23 & 0xfffffffffffff;
  puVar22 = (uchar *)(auStack_368._32_8_ & 0xffffffffffff);
  auStack_368._32_8_ = puVar22 + (uVar23 >> 0x34);
  a_01 = (secp256k1_ecmult_gen_context *)(uVar11 & 0xfffffffffffff);
  auStack_368._8_8_ = auStack_368._8_8_ & 0xfffffffffffff;
  auStack_368._0_8_ = auStack_368._0_8_ & 0xfffffffffffff;
  auStack_368._40_4_ = 1;
  pcStack_440 = (code *)0x10f248;
  auStack_368._16_8_ = a_01;
  secp256k1_fe_verify((secp256k1_fe *)psVar12);
  pcStack_440 = (code *)0x10f250;
  ecmult_gen_ctx = r_00;
  iVar8 = secp256k1_ge_x_on_curve_var((secp256k1_fe *)r_00);
  r = (secp256k1_ecmult_gen_context *)0xfffffffffffff;
  if (iVar8 == 0) goto LAB_0010fdfa;
  uStack_3cc = uVar13;
  if ((bVar3 & 2) != 0) {
    pcStack_440 = (code *)0x10f594;
    secp256k1_fe_verify((secp256k1_fe *)psVar12);
    a_01 = (secp256k1_ecmult_gen_context *)0x1;
    pcStack_440 = (code *)0x10f5a5;
    secp256k1_fe_verify_magnitude((secp256k1_fe *)(auStack_368._40_8_ & 0xffffffff),1);
    auStack_438._48_8_ = 0x3ffffbfffff0bc - auStack_368._0_8_;
    uStack_400 = 0x3ffffffffffffc - auStack_368._8_8_;
    puStack_3f8 = (undefined1 *)(0x3ffffffffffffc - auStack_368._16_8_);
    uStack_3f0 = 0x3ffffffffffffc - auStack_368._24_8_;
    puStack_3e8 = (uchar *)(0x3fffffffffffc - auStack_368._32_8_);
    uStack_3e0 = 2;
    pcStack_440 = (code *)0x10f5fb;
    secp256k1_fe_verify((secp256k1_fe *)psVar27);
    auStack_438._32_8_ = puStack_3e8;
    auStack_438._40_8_ = uStack_3e0;
    auStack_438._16_8_ = puStack_3f8;
    auStack_438._24_8_ = uStack_3f0;
    auStack_438._0_8_ = auStack_438._48_8_;
    auStack_438._8_8_ = uStack_400;
    pcStack_440 = (code *)0x10f625;
    secp256k1_fe_verify((secp256k1_fe *)auStack_438);
    ecmult_gen_ctx = (secp256k1_ecmult_gen_context *)(auStack_3c8 + 0x30);
    pcStack_440 = (code *)0x10f632;
    secp256k1_fe_verify((secp256k1_fe *)ecmult_gen_ctx);
    r = (secp256k1_ecmult_gen_context *)(auStack_368 + 0x30);
    if (0x20 < (int)uStack_370 + auStack_438._40_4_) goto LAB_0010fdff;
    auStack_438._0_8_ = auStack_438._0_8_ + auStack_3c8._48_8_;
    auStack_438._8_8_ = auStack_438._8_8_ + uStack_390;
    auStack_438._16_8_ = auStack_438._16_8_ + uStack_388;
    auStack_438._24_8_ = auStack_438._24_8_ + uStack_380;
    auStack_438._32_8_ = auStack_438._32_8_ + (long)puStack_378;
    auStack_438._44_4_ = 0;
    auStack_438._40_4_ = (int)uStack_370 + auStack_438._40_4_;
    pcStack_440 = (code *)0x10f697;
    puVar22 = puStack_378;
    secp256k1_fe_verify((secp256k1_fe *)auStack_438);
    pcStack_440 = (code *)0x10f69f;
    iVar8 = secp256k1_fe_is_square_var((secp256k1_fe *)auStack_438);
    if (iVar8 == 0) goto LAB_0010fade;
    pcStack_440 = (code *)0x10f6b2;
    secp256k1_fe_sqr((secp256k1_fe *)r,(secp256k1_fe *)psVar12);
    r_00 = (secp256k1_ecmult_gen_context *)auStack_3c8;
    pcStack_440 = (code *)0x10f6c5;
    a_01 = (secp256k1_ecmult_gen_context *)auStack_438;
    secp256k1_fe_mul((secp256k1_fe *)r_00,(secp256k1_fe *)auStack_438,(secp256k1_fe *)r);
    pcStack_440 = (code *)0x10f6cd;
    ecmult_gen_ctx = r_00;
    secp256k1_fe_verify((secp256k1_fe *)r_00);
    if (10 < (int)auStack_3c8._40_4_) goto LAB_0010fe09;
    auStack_3c8._0_8_ = auStack_3c8._0_8_ * 3;
    auStack_3c8._8_8_ = auStack_3c8._8_8_ * 3;
    auStack_3c8._16_8_ = auStack_3c8._16_8_ * 3;
    auStack_3c8._24_8_ = auStack_3c8._24_8_ * 3;
    puVar22 = (uchar *)(auStack_3c8._32_8_ * 3);
    auStack_3c8._44_4_ = 0;
    auStack_3c8._40_4_ = auStack_3c8._40_4_ * 3;
    pcStack_440 = (code *)0x10f752;
    auStack_3c8._32_8_ = puVar22;
    secp256k1_fe_verify((secp256k1_fe *)r_00);
    pcStack_440 = (code *)0x10f760;
    a_01 = r;
    secp256k1_fe_mul((secp256k1_fe *)r,(secp256k1_fe *)r,(secp256k1_fe *)psVar12);
    pcStack_440 = (code *)0x10f768;
    ecmult_gen_ctx = r;
    secp256k1_fe_verify((secp256k1_fe *)r);
    if (8 < iStack_310) goto LAB_0010fe0e;
    auStack_368._48_8_ = auStack_368._48_8_ << 2;
    uStack_330 = uStack_330 << 2;
    uStack_328 = uStack_328 << 2;
    uStack_320 = uStack_320 << 2;
    puStack_318 = (uchar *)((long)puStack_318 << 2);
    iStack_310 = iStack_310 << 2;
    uStack_30c = 0;
    pcStack_440 = (code *)0x10f7d1;
    secp256k1_fe_verify((secp256k1_fe *)(auStack_368 + 0x30));
    pcStack_440 = (code *)0x10f7de;
    secp256k1_fe_verify((secp256k1_fe *)(auStack_368 + 0x30));
    auStack_368._48_8_ = auStack_368._48_8_ + 8;
    iStack_310 = iStack_310 + 1;
    uStack_30c = 0;
    r = (secp256k1_ecmult_gen_context *)(auStack_368 + 0x30);
    pcStack_440 = (code *)0x10f806;
    secp256k1_fe_verify((secp256k1_fe *)r);
    pcStack_440 = (code *)0x10f80e;
    secp256k1_fe_verify((secp256k1_fe *)r_00);
    pcStack_440 = (code *)0x10f816;
    ecmult_gen_ctx = r;
    secp256k1_fe_verify((secp256k1_fe *)r);
    if (0x20 < iStack_310 + auStack_3c8._40_4_) goto LAB_0010fe13;
    auStack_3c8._0_8_ = auStack_3c8._0_8_ + auStack_368._48_8_;
    auStack_3c8._8_8_ = auStack_3c8._8_8_ + uStack_330;
    auStack_3c8._16_8_ = auStack_3c8._16_8_ + uStack_328;
    auStack_3c8._24_8_ = auStack_3c8._24_8_ + uStack_320;
    auStack_3c8._32_8_ = auStack_3c8._32_8_ + (long)puStack_318;
    auStack_3c8._44_4_ = 0;
    auStack_3c8._40_4_ = iStack_310 + auStack_3c8._40_4_;
    pcStack_440 = (code *)0x10f887;
    puVar22 = puStack_318;
    secp256k1_fe_verify((secp256k1_fe *)r_00);
    pcStack_440 = (code *)0x10f895;
    secp256k1_fe_mul((secp256k1_fe *)r_00,(secp256k1_fe *)r_00,(secp256k1_fe *)auStack_438);
    pcStack_440 = (code *)0x10f89d;
    secp256k1_fe_verify((secp256k1_fe *)r_00);
    pcStack_440 = (code *)0x10f8ae;
    secp256k1_fe_verify_magnitude((secp256k1_fe *)(auStack_3c8._40_8_ & 0xffffffff),1);
    auStack_3c8._0_8_ = 0x3ffffbfffff0bc - auStack_3c8._0_8_;
    auStack_3c8._8_8_ = 0x3ffffffffffffc - auStack_3c8._8_8_;
    auStack_3c8._16_8_ = 0x3ffffffffffffc - auStack_3c8._16_8_;
    auStack_3c8._24_8_ = 0x3ffffffffffffc - auStack_3c8._24_8_;
    auStack_3c8._32_8_ = 0x3fffffffffffc - auStack_3c8._32_8_;
    auStack_3c8._40_8_ = 2;
    pcStack_440 = (code *)0x10f90a;
    secp256k1_fe_verify((secp256k1_fe *)r_00);
    pcStack_440 = (code *)0x10f912;
    iVar8 = secp256k1_fe_is_square_var((secp256k1_fe *)r_00);
    if (iVar8 != 0) {
      ecmult_gen_ctx = (secp256k1_ecmult_gen_context *)auStack_278;
      a_01 = (secp256k1_ecmult_gen_context *)auStack_3c8;
      pcStack_440 = (code *)0x10f92c;
      iVar8 = secp256k1_fe_sqrt((secp256k1_fe *)ecmult_gen_ctx,(secp256k1_fe *)a_01);
      if (iVar8 == 0) goto LAB_0010fe2c;
      if ((uStack_3cc & 1) != 0) {
        pcStack_440 = (code *)0x10f94c;
        secp256k1_fe_verify((secp256k1_fe *)auStack_278);
        uVar11 = ((ulong)auStack_278._32_8_ >> 0x30) * 0x1000003d1 + auStack_278._0_8_;
        if (((uVar11 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar11 & 0xfffffffffffff) == 0)) {
          uVar23 = (uVar11 >> 0x34) + auStack_278._8_8_;
          uVar25 = (uVar23 >> 0x34) + auStack_278._16_8_;
          uVar26 = (uVar25 >> 0x34) + auStack_278._24_8_;
          uVar30 = (uVar26 >> 0x34) + (auStack_278._32_8_ & 0xffffffffffff);
          if ((((uVar23 | uVar11 | uVar25 | uVar26) & 0xfffffffffffff) == 0 && uVar30 == 0) ||
             ((uVar11 + 0x1000003d0 & uVar23 & uVar25 & uVar26 & (uVar30 ^ 0xf000000000000)) ==
              0xfffffffffffff)) goto LAB_0010fade;
        }
      }
      pcStack_440 = (code *)0x10fa25;
      secp256k1_fe_verify((secp256k1_fe *)auStack_438);
      uVar11 = ((ulong)auStack_438._32_8_ >> 0x30) * 0x1000003d1 + auStack_438._0_8_;
      if (((uVar11 & 0xfffffffffffff) == 0xffffefffffc2f) ||
         (puVar22 = (uchar *)auStack_438._32_8_, (uVar11 & 0xfffffffffffff) == 0)) {
        uVar23 = (uVar11 >> 0x34) + auStack_438._8_8_;
        uVar25 = (uVar23 >> 0x34) + auStack_438._16_8_;
        uVar26 = (uVar25 >> 0x34) + auStack_438._24_8_;
        uVar30 = (uVar26 >> 0x34) + (auStack_438._32_8_ & 0xffffffffffff);
        if ((((uVar23 | uVar11 | uVar25 | uVar26) & 0xfffffffffffff) == 0 && uVar30 == 0) ||
           (puVar22 = (uchar *)0x1000003d1,
           (uVar11 + 0x1000003d0 & uVar23 & uVar25 & uVar26 & (uVar30 ^ 0xf000000000000)) ==
           0xfffffffffffff)) goto LAB_0010fade;
      }
      psVar12 = (secp256k1_ecmult_gen_context *)(auStack_2d8 + 0x30);
      pcStack_440 = (code *)0x10fb10;
      secp256k1_fe_inv_var((secp256k1_fe *)psVar12,(secp256k1_fe *)auStack_438);
      pcStack_440 = (code *)0x10fb23;
      a_01 = psVar12;
      secp256k1_fe_mul((secp256k1_fe *)psVar12,(secp256k1_fe *)psVar12,(secp256k1_fe *)auStack_278);
      pcStack_440 = (code *)0x10fb2b;
      secp256k1_fe_verify((secp256k1_fe *)psVar12);
      psVar27 = (secp256k1_ecmult_gen_context *)(auStack_438 + 0x30);
      pcStack_440 = (code *)0x10fb38;
      ecmult_gen_ctx = psVar27;
      secp256k1_fe_verify((secp256k1_fe *)psVar27);
      if (0x20 < (int)uStack_3e0 + (int)uStack_280) goto LAB_0010fe31;
      a_00 = (secp256k1_ecmult_gen_context *)(auStack_2d8 + 0x30);
      auStack_2d8._48_8_ = auStack_2d8._48_8_ + auStack_438._48_8_;
      uStack_2a0 = uStack_2a0 + uStack_400;
      uStack_298 = uStack_298 + (long)puStack_3f8;
      uStack_290 = uStack_290 + uStack_3f0;
      puStack_288 = puStack_288 + (long)puStack_3e8;
      uStack_280 = (ulong)(uint)((int)uStack_3e0 + (int)uStack_280);
      pcStack_440 = (code *)0x10fb89;
      puVar22 = puStack_3e8;
      secp256k1_fe_verify((secp256k1_fe *)a_00);
      pcStack_440 = (code *)0x10fb91;
      secp256k1_fe_half((secp256k1_fe *)a_00);
      psVar31 = r_00;
      goto LAB_0010fb91;
    }
LAB_0010fade:
    uVar23 = (ulong)((int)uStack_2e0 + 1);
    uVar11 = uStack_2f8;
    goto LAB_0010ef0e;
  }
  puStack_3e8 = puStack_378;
  uStack_3e0 = uStack_370;
  puStack_3f8 = (undefined1 *)uStack_388;
  uStack_3f0 = uStack_380;
  auStack_438._48_8_ = auStack_3c8._48_8_;
  uStack_400 = uStack_390;
  pcStack_440 = (code *)0x10f297;
  secp256k1_fe_verify((secp256k1_fe *)psVar27);
  pcStack_440 = (code *)0x10f29f;
  ecmult_gen_ctx = psVar12;
  secp256k1_fe_verify((secp256k1_fe *)psVar12);
  r = (secp256k1_ecmult_gen_context *)(auStack_368 + 0x30);
  r_00 = (secp256k1_ecmult_gen_context *)auStack_438;
  if (0x20 < auStack_368._40_4_ + (int)uStack_3e0) goto LAB_0010fe04;
  auStack_438._48_8_ = auStack_438._48_8_ + auStack_368._0_8_;
  uStack_400 = uStack_400 + auStack_368._8_8_;
  puStack_3f8 = (undefined1 *)
                ((long)(((secp256k1_ge *)(auStack_368._16_8_ + 8))->x).n + ((long)puStack_3f8 - 8U))
  ;
  uStack_3f0 = uStack_3f0 + auStack_368._24_8_;
  puStack_3e8 = puStack_3e8 + auStack_368._32_8_;
  uStack_3e0 = (ulong)(uint)(auStack_368._40_4_ + (int)uStack_3e0);
  pcStack_440 = (code *)0x10f309;
  puVar22 = (uchar *)auStack_368._32_8_;
  secp256k1_fe_verify((secp256k1_fe *)psVar27);
  pcStack_440 = (code *)0x10f311;
  secp256k1_fe_verify((secp256k1_fe *)psVar27);
  pcStack_440 = (code *)0x10f31f;
  secp256k1_fe_verify_magnitude((secp256k1_fe *)(uStack_3e0 & 0xffffffff),2);
  auStack_438._48_8_ = 0x5ffff9ffffe91a - auStack_438._48_8_;
  uStack_400 = 0x5ffffffffffffa - uStack_400;
  puStack_3f8 = (undefined1 *)(0x5ffffffffffffa - (long)puStack_3f8);
  uStack_3f0 = 0x5ffffffffffffa - uStack_3f0;
  puStack_3e8 = (uchar *)(0x5fffffffffffa - (long)puStack_3e8);
  uStack_3e0 = 3;
  pcStack_440 = (code *)0x10f36c;
  secp256k1_fe_verify((secp256k1_fe *)psVar27);
  pcStack_440 = (code *)0x10f374;
  iVar8 = secp256k1_ge_x_on_curve_var((secp256k1_fe *)psVar27);
  if (iVar8 != 0) goto LAB_0010fade;
  pcStack_440 = (code *)0x10f387;
  secp256k1_fe_sqr((secp256k1_fe *)auStack_438,(secp256k1_fe *)psVar27);
  pcStack_440 = (code *)0x10f38f;
  secp256k1_fe_verify((secp256k1_fe *)auStack_438);
  pcStack_440 = (code *)0x10f39d;
  secp256k1_fe_verify_magnitude((secp256k1_fe *)(auStack_438._40_8_ & 0xffffffff),1);
  auStack_438._0_8_ = 0x3ffffbfffff0bc - auStack_438._0_8_;
  auStack_438._8_8_ = 0x3ffffffffffffc - auStack_438._8_8_;
  auStack_438._16_8_ = 0x3ffffffffffffc - auStack_438._16_8_;
  auStack_438._24_8_ = 0x3ffffffffffffc - auStack_438._24_8_;
  auStack_438._32_8_ = 0x3fffffffffffc - auStack_438._32_8_;
  auStack_438._40_8_ = 2;
  pcStack_440 = (code *)0x10f3e8;
  secp256k1_fe_verify((secp256k1_fe *)auStack_438);
  pcStack_440 = (code *)0x10f3fb;
  a_01 = psVar12;
  secp256k1_fe_mul((secp256k1_fe *)psVar27,(secp256k1_fe *)psVar12,
                   (secp256k1_fe *)(auStack_3c8 + 0x30));
  pcStack_440 = (code *)0x10f403;
  secp256k1_fe_verify((secp256k1_fe *)auStack_438);
  pcStack_440 = (code *)0x10f40b;
  ecmult_gen_ctx = psVar27;
  secp256k1_fe_verify((secp256k1_fe *)psVar27);
  r_00 = (secp256k1_ecmult_gen_context *)auStack_438;
  if (0x20 < (int)uStack_3e0 + auStack_438._40_4_) goto LAB_0010fe36;
  auStack_438._0_8_ = auStack_438._0_8_ + auStack_438._48_8_;
  auStack_438._8_8_ = auStack_438._8_8_ + uStack_400;
  auStack_438._16_8_ = auStack_438._16_8_ + (long)puStack_3f8;
  auStack_438._24_8_ = auStack_438._24_8_ + uStack_3f0;
  auStack_438._32_8_ = auStack_438._32_8_ + (long)puStack_3e8;
  auStack_438._44_4_ = 0;
  auStack_438._40_4_ = (int)uStack_3e0 + auStack_438._40_4_;
  pcStack_440 = (code *)0x10f45c;
  secp256k1_fe_verify((secp256k1_fe *)auStack_438);
  pcStack_440 = (code *)0x10f464;
  secp256k1_fe_verify((secp256k1_fe *)auStack_438);
  uVar11 = ((ulong)auStack_438._32_8_ >> 0x30) * 0x1000003d1 + auStack_438._0_8_;
  if (((uVar11 & 0xfffffffffffff) == 0xffffefffffc2f) ||
     (puVar22 = (uchar *)auStack_438._32_8_, (uVar11 & 0xfffffffffffff) == 0)) {
    uVar23 = (uVar11 >> 0x34) + auStack_438._8_8_;
    a_01 = (secp256k1_ecmult_gen_context *)((uVar23 >> 0x34) + auStack_438._16_8_);
    ecmult_gen_ctx = (secp256k1_ecmult_gen_context *)(((ulong)a_01 >> 0x34) + auStack_438._24_8_);
    uVar25 = ((ulong)ecmult_gen_ctx >> 0x34) + (auStack_438._32_8_ & 0xffffffffffff);
    puVar22 = (uchar *)((uVar23 | uVar11 | (ulong)a_01 | (ulong)ecmult_gen_ctx) & 0xfffffffffffff |
                       uVar25);
    r_00 = (secp256k1_ecmult_gen_context *)auStack_438;
    if ((puVar22 == (uchar *)0x0) ||
       (puVar22 = (uchar *)0x1000003d1, r_00 = (secp256k1_ecmult_gen_context *)auStack_438,
       (uVar11 + 0x1000003d0 & uVar23 & (ulong)a_01 & (ulong)ecmult_gen_ctx &
       (uVar25 ^ 0xf000000000000)) == 0xfffffffffffff)) goto LAB_0010fe3b;
  }
  pcStack_440 = (code *)0x10f530;
  secp256k1_fe_sqr((secp256k1_fe *)r,(secp256k1_fe *)psVar12);
  pcStack_440 = (code *)0x10f53e;
  secp256k1_fe_mul((secp256k1_fe *)r,(secp256k1_fe *)r,(secp256k1_fe *)psVar12);
  pcStack_440 = (code *)0x10f546;
  secp256k1_fe_verify((secp256k1_fe *)r);
  auStack_368._48_8_ = auStack_368._48_8_ + 2;
  iStack_310 = iStack_310 + 1;
  uStack_30c = 0;
  pcStack_440 = (code *)0x10f569;
  secp256k1_fe_verify((secp256k1_fe *)r);
  pcStack_440 = (code *)0x10f577;
  secp256k1_fe_mul((secp256k1_fe *)psVar27,(secp256k1_fe *)auStack_438,(secp256k1_fe *)r);
  pcStack_440 = (code *)0x10f57f;
  iVar8 = secp256k1_fe_is_square_var((secp256k1_fe *)psVar27);
  if (iVar8 == 0) goto LAB_0010fade;
  pcStack_440 = (code *)0x10fda7;
  secp256k1_fe_inv_var((secp256k1_fe *)auStack_438,(secp256k1_fe *)auStack_438);
  pcStack_440 = (code *)0x10fdba;
  secp256k1_fe_mul((secp256k1_fe *)auStack_438,(secp256k1_fe *)auStack_438,
                   (secp256k1_fe *)(auStack_368 + 0x30));
  auStack_2d8._48_8_ = auStack_3c8._48_8_;
  uStack_2a0 = uStack_390;
  uStack_298 = uStack_388;
  uStack_290 = uStack_380;
  puStack_288 = puStack_378;
  uStack_280 = uStack_370;
  psVar31 = (secp256k1_ecmult_gen_context *)auStack_438;
LAB_0010fb91:
  r = (secp256k1_ecmult_gen_context *)(auStack_368 + 0x30);
  ecmult_gen_ctx = (secp256k1_ecmult_gen_context *)(auStack_438 + 0x30);
  pcStack_440 = (code *)0x10fb9e;
  iVar8 = secp256k1_fe_sqrt((secp256k1_fe *)ecmult_gen_ctx,(secp256k1_fe *)auStack_438);
  uVar13 = uStack_3cc;
  puVar16 = (undefined1 *)(ulong)uStack_3cc;
  psVar12 = a_00;
  a_01 = psVar24;
  r_00 = psVar31;
  if (iVar8 == 0) {
LAB_0010fe18:
    psVar27 = (secp256k1_ecmult_gen_context *)(auStack_438 + 0x30);
    pcStack_440 = (code *)0x10fe1d;
    secp256k1_ellswift_elligatorswift_var_cold_12();
LAB_0010fe1d:
    pcStack_440 = (code *)0x10fe22;
    secp256k1_ellswift_elligatorswift_var_cold_11();
    psVar31 = r_00;
  }
  else {
    if (((uStack_3cc & 5) == 5) || ((uStack_3cc & 5) == 0)) {
      pcStack_440 = (code *)0x10fbc5;
      secp256k1_fe_verify((secp256k1_fe *)(auStack_438 + 0x30));
      pcStack_440 = (code *)0x10fbd2;
      secp256k1_fe_verify_magnitude((secp256k1_fe *)(uStack_3e0 & 0xffffffff),1);
      auStack_438._48_8_ = 0x3ffffbfffff0bc - auStack_438._48_8_;
      uStack_400 = 0x3ffffffffffffc - uStack_400;
      puStack_3f8 = (undefined1 *)(0x3ffffffffffffc - (long)puStack_3f8);
      uStack_3f0 = 0x3ffffffffffffc - uStack_3f0;
      puStack_3e8 = (uchar *)(0x3fffffffffffc - (long)puStack_3e8);
      uStack_3e0 = 2;
      pcStack_440 = (code *)0x10fc16;
      secp256k1_fe_verify((secp256k1_fe *)(auStack_438 + 0x30));
    }
    b_00 = &secp256k1_ellswift_c4;
    if ((uVar13 & 1) == 0) {
      b_00 = &secp256k1_ellswift_c3;
    }
    psVar12 = (secp256k1_ecmult_gen_context *)auStack_368;
    pcStack_440 = (code *)0x10fc3f;
    a_01 = psVar12;
    secp256k1_fe_mul((secp256k1_fe *)psVar12,(secp256k1_fe *)psVar12,b_00);
    pcStack_440 = (code *)0x10fc47;
    secp256k1_fe_verify((secp256k1_fe *)psVar12);
    psVar27 = (secp256k1_ecmult_gen_context *)(auStack_2d8 + 0x30);
    pcStack_440 = (code *)0x10fc57;
    ecmult_gen_ctx = psVar27;
    secp256k1_fe_verify((secp256k1_fe *)psVar27);
    if (0x20 < (int)uStack_280 + auStack_368._40_4_) goto LAB_0010fe1d;
    psVar12 = (secp256k1_ecmult_gen_context *)auStack_368;
    auStack_368._0_8_ = auStack_368._0_8_ + auStack_2d8._48_8_;
    auStack_368._8_8_ = auStack_368._8_8_ + uStack_2a0;
    auStack_368._16_8_ = (long)(((secp256k1_ge *)(auStack_368._16_8_ + 8))->x).n + (uStack_298 - 8);
    auStack_368._24_8_ = auStack_368._24_8_ + uStack_290;
    auStack_368._32_8_ = auStack_368._32_8_ + (long)puStack_288;
    auStack_368._44_4_ = 0;
    auStack_368._40_4_ = (int)uStack_280 + auStack_368._40_4_;
    pcStack_440 = (code *)0x10fcb1;
    puVar22 = puStack_288;
    secp256k1_fe_verify((secp256k1_fe *)psVar12);
    r = psStack_2f0;
    a_01 = (secp256k1_ecmult_gen_context *)(auStack_438 + 0x30);
    pcStack_440 = (code *)0x10fcc9;
    secp256k1_fe_mul((secp256k1_fe *)psStack_2f0,(secp256k1_fe *)a_01,(secp256k1_fe *)psVar12);
    pcStack_440 = (code *)0x10fcd1;
    secp256k1_fe_normalize_var((secp256k1_fe *)r);
    pcStack_440 = (code *)0x10fcd9;
    ecmult_gen_ctx = r;
    secp256k1_fe_verify((secp256k1_fe *)r);
    r_00 = psStack_300;
    if (*(int *)((long)(r->ge_offset).x.n + 0x24) != 0) {
      psVar27 = *(secp256k1_ecmult_gen_context **)r;
      psVar12 = (secp256k1_ecmult_gen_context *)&(psStack_300->ge_offset).x.magnitude;
      pcStack_440 = (code *)0x10fcfd;
      ecmult_gen_ctx = psVar12;
      secp256k1_fe_verify((secp256k1_fe *)psVar12);
      puVar20 = puVar16;
      if (*(int *)((long)(r_00->ge_offset).y.n + 0x24) != 0) {
        iVar8 = extraout_EAX;
        if ((((uint)psVar27 ^ *(uint *)psVar12) & 1) != 0) {
          pcStack_440 = (code *)0x10fd19;
          secp256k1_fe_verify((secp256k1_fe *)r);
          pcStack_440 = (code *)0x10fd28;
          secp256k1_fe_verify_magnitude((secp256k1_fe *)(ulong)(uint)(r->ge_offset).x.n[4],1);
          uVar14 = (r->ge_offset).x.n[0];
          uVar28 = (r->ge_offset).x.n[1];
          uVar29 = (r->ge_offset).x.n[2];
          *(long *)r = 0x3ffffbfffff0bc - *(long *)r;
          (r->ge_offset).x.n[0] = 0x3ffffffffffffc - uVar14;
          (r->ge_offset).x.n[1] = 0x3ffffffffffffc - uVar28;
          (r->ge_offset).x.n[2] = 0x3ffffffffffffc - uVar29;
          (r->ge_offset).x.n[3] = 0x3fffffffffffc - (r->ge_offset).x.n[3];
          (r->ge_offset).x.n[4] = 2;
          pcStack_440 = (code *)0x10fd7f;
          secp256k1_fe_verify((secp256k1_fe *)r);
          pcStack_440 = (code *)0x10fd87;
          secp256k1_fe_normalize_var((secp256k1_fe *)r);
          iVar8 = extraout_EAX_00;
        }
        return iVar8;
      }
      goto LAB_0010fe27;
    }
  }
  r_00 = psVar31;
  pcStack_440 = (code *)0x10fe27;
  secp256k1_ellswift_elligatorswift_var_cold_10();
  puVar20 = puVar16;
LAB_0010fe27:
  pcStack_440 = (code *)0x10fe2c;
  secp256k1_ellswift_elligatorswift_var_cold_9();
LAB_0010fe2c:
  pcStack_440 = (code *)0x10fe31;
  secp256k1_ellswift_elligatorswift_var_cold_3();
  puVar21 = puVar20;
LAB_0010fe31:
  pcStack_440 = (code *)0x10fe36;
  secp256k1_ellswift_elligatorswift_var_cold_2();
  puVar15 = puVar21;
LAB_0010fe36:
  pcStack_440 = (code *)0x10fe3b;
  secp256k1_ellswift_elligatorswift_var_cold_13();
LAB_0010fe3b:
  pcStack_440 = secp256k1_ellswift_create;
  secp256k1_ellswift_elligatorswift_var_cold_8();
  uStack_458 = 0xfffffffffffff;
  psStack_468 = psVar12;
  psStack_460 = r;
  psStack_450 = r_00;
  psStack_448 = psVar27;
  pcStack_440 = (code *)puVar15;
  if (ecmult_gen_ctx == (secp256k1_ecmult_gen_context *)0x0) {
    secp256k1_ellswift_create_cold_6();
  }
  else if (a_01 != (secp256k1_ecmult_gen_context *)0x0) {
    *(undefined1 (*) [16])&(a_01->ge_offset).x.magnitude = (undefined1  [16])0x0;
    (a_01->ge_offset).x.n[3] = 0;
    (a_01->ge_offset).x.n[4] = 0;
    (a_01->ge_offset).x.n[1] = 0;
    (a_01->ge_offset).x.n[2] = 0;
    a_01->built = 0;
    a_01->scalar_offset = 0;
    (a_01->ge_offset).x.n[0] = 0;
    if (ecmult_gen_ctx->built == 0) {
      secp256k1_ellswift_create_cold_4();
      return 0;
    }
    if (seckey == (uchar *)0x0) {
      secp256k1_ellswift_create_cold_3();
      return 0;
    }
    iVar8 = secp256k1_ec_pubkey_create_helper(ecmult_gen_ctx,&sStack_56c,&sStack_568,seckey);
    if ((int)ecmult_gen_ctx[1].ge_offset.x.n[3] != 0) {
      secp256k1_ellswift_create_cold_1();
    }
    secp256k1_fe_normalize_var(&sStack_568.x);
    secp256k1_fe_normalize_var(&sStack_568.y);
    sStack_500.s[0] = 0xd29e1bf5;
    sStack_500.s[1] = 0xf7025f42;
    sStack_500.s[2] = 0x9b024773;
    sStack_500.s[3] = 0x94cb7d5;
    sStack_500.s[4] = 0xe59ed789;
    sStack_500.s[5] = 0x3bc9786;
    sStack_500.s[6] = 0x68335b35;
    sStack_500.s[7] = 0x4e363b53;
    sStack_500.bytes = 0x40;
    secp256k1_sha256_write(&sStack_500,seckey,0x20);
    secp256k1_sha256_write(&sStack_500,"",0x20);
    if ((int)ecmult_gen_ctx[1].ge_offset.x.n[3] != 0) {
      secp256k1_ellswift_create_cold_2();
    }
    if (puVar22 != (uchar *)0x0) {
      secp256k1_sha256_write(&sStack_500,puVar22,0x20);
    }
    secp256k1_ellswift_elligatorswift_var((uchar *)a_01,&sStack_498,&sStack_568,&sStack_500);
    secp256k1_fe_get_b32((uchar *)((a_01->ge_offset).x.n + 3),&sStack_498);
    cVar7 = ((byte)iVar8 ^ 1) - 1;
    auVar33 = ZEXT216(CONCAT11(cVar7,cVar7));
    auVar33 = pshuflw(auVar33,auVar33,0);
    uVar13 = auVar33._0_4_;
    lVar9 = 0;
    do {
      puVar1 = (uint *)((long)(a_01->ge_offset).x.n + lVar9 + -8);
      uVar4 = puVar1[1];
      uVar5 = puVar1[2];
      uVar6 = puVar1[3];
      puVar2 = (uint *)((long)(a_01->ge_offset).x.n + lVar9 + -8);
      *puVar2 = *puVar1 & uVar13;
      puVar2[1] = uVar4 & uVar13;
      puVar2[2] = uVar5 & uVar13;
      puVar2[3] = uVar6 & uVar13;
      lVar9 = lVar9 + 0x10;
    } while (lVar9 != 0x40);
    return iVar8;
  }
  secp256k1_ellswift_create_cold_5();
  return 0;
}

Assistant:

SECP256K1_INLINE static int secp256k1_fe_equal(const secp256k1_fe *a, const secp256k1_fe *b) {
    secp256k1_fe na;
    SECP256K1_FE_VERIFY(a);
    SECP256K1_FE_VERIFY(b);
    SECP256K1_FE_VERIFY_MAGNITUDE(a, 1);
    SECP256K1_FE_VERIFY_MAGNITUDE(b, 31);

    secp256k1_fe_negate(&na, a, 1);
    secp256k1_fe_add(&na, b);
    return secp256k1_fe_normalizes_to_zero(&na);
}